

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O3

symbol ** Symbol_arrayof(void)

{
  int iVar1;
  s_x2node *psVar2;
  s_x2 *psVar3;
  symbol **ppsVar4;
  long lVar5;
  
  psVar3 = x2a;
  if (x2a != (s_x2 *)0x0) {
    iVar1 = x2a->count;
    ppsVar4 = (symbol **)calloc((long)iVar1,8);
    if (ppsVar4 != (symbol **)0x0) {
      if (iVar1 < 1) {
        return ppsVar4;
      }
      psVar2 = psVar3->tbl;
      lVar5 = 0;
      do {
        *(undefined8 *)((long)ppsVar4 + lVar5) = *(undefined8 *)((long)&psVar2->data + lVar5 * 4);
        lVar5 = lVar5 + 8;
      } while ((long)iVar1 * 8 != lVar5);
      return ppsVar4;
    }
  }
  return (symbol **)0x0;
}

Assistant:

struct symbol **Symbol_arrayof()
{
  struct symbol **array;
  int i,size;
  if( x2a==0 ) return 0;
  size = x2a->count;
  array = (struct symbol **)calloc(size, sizeof(struct symbol *));
  if( array ){
    for(i=0; i<size; i++) array[i] = x2a->tbl[i].data;
  }
  return array;
}